

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::EndpointInfo::getMessage(EndpointInfo *this,Time maxTime)

{
  _Elt_pointer puVar1;
  GlobalHandle *pGVar2;
  long in_RDX;
  handle handle;
  handle local_38;
  
  if (*(int *)(maxTime.internalTimeCode + 0xd0) < 1) {
LAB_002ba335:
    (this->id).fed_id = 0;
    (this->id).handle = 0;
  }
  else {
    gmlc::libguarded::
    shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
    ::lock(&local_38,
           (shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
            *)(maxTime.internalTimeCode + 0x48));
    puVar1 = ((local_38.data)->
             super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((local_38.data)->
        super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        )._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) {
      (this->id).fed_id = 0;
      (this->id).handle = 0;
    }
    else {
      if (in_RDX < (((puVar1->_M_t).
                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).
                   internalTimeCode) {
        std::unique_lock<std::shared_mutex>::~unique_lock(&local_38.m_handle_lock);
        goto LAB_002ba335;
      }
      if (0 < *(int *)(maxTime.internalTimeCode + 0xd0)) {
        LOCK();
        *(int *)(maxTime.internalTimeCode + 0xd0) = *(int *)(maxTime.internalTimeCode + 0xd0) + -1;
        UNLOCK();
      }
      pGVar2 = (GlobalHandle *)
               ((local_38.data)->
               super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      this->id = *pGVar2;
      pGVar2->fed_id = 0;
      pGVar2->handle = 0;
      std::
      deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::pop_front(local_38.data);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_38.m_handle_lock);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> EndpointInfo::getMessage(Time maxTime)
{
    if (mAvailableMessages.load() > 0) {
        auto handle = message_queue.lock();
        if (handle->empty()) {
            return nullptr;
        }
        if (handle->front()->time <= maxTime) {
            if (mAvailableMessages > 0) {
                --mAvailableMessages;
            }
            auto msg = std::move(handle->front());
            handle->pop_front();
            return msg;
        }
    }
    return nullptr;
}